

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,Node *parent,Reader *declaration)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Impl *pIVar3;
  void *pvVar4;
  WirePointer *pWVar5;
  StructDataBitCount SVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  uint32_t uVar10;
  uint64_t uVar11;
  uint32_t uVar12;
  long lVar13;
  int iVar14;
  size_t in_R8;
  CapTableReader *pCVar15;
  Which WVar16;
  ListReader *__return_storage_ptr__;
  StringPtr SVar17;
  Reader RVar18;
  ArrayPtr<const_char> AVar19;
  Reader name;
  ListReader local_80;
  PointerReader local_50;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_0020dfb0;
  this->module = parent->module;
  (this->parent).ptr = parent;
  pCVar15 = (declaration->_reader).capTable;
  pvVar4 = (declaration->_reader).data;
  pWVar5 = (declaration->_reader).pointers;
  SVar6 = (declaration->_reader).dataSize;
  SVar7 = (declaration->_reader).pointerCount;
  uVar8 = *(undefined2 *)&(declaration->_reader).field_0x26;
  iVar14 = (declaration->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(declaration->_reader).field_0x2c;
  (this->declaration)._reader.segment = (declaration->_reader).segment;
  (this->declaration)._reader.capTable = pCVar15;
  (this->declaration)._reader.data = pvVar4;
  (this->declaration)._reader.pointers = pWVar5;
  (this->declaration)._reader.dataSize = SVar6;
  (this->declaration)._reader.pointerCount = SVar7;
  *(undefined2 *)&(this->declaration)._reader.field_0x26 = uVar8;
  (this->declaration)._reader.nestingLimit = iVar14;
  *(undefined4 *)&(this->declaration)._reader.field_0x2c = uVar9;
  if ((declaration->_reader).pointerCount == 0) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.segment = (declaration->_reader).segment;
    local_50.capTable = (declaration->_reader).capTable;
    local_50.pointer = (declaration->_reader).pointers;
    local_50.nestingLimit = (declaration->_reader).nestingLimit;
  }
  uVar11 = parent->id;
  _::PointerReader::getStruct((StructReader *)&local_80,&local_50,(word *)0x0);
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  local_50.capTable = (CapTableReader *)0x0;
  local_50.nestingLimit = 0x7fffffff;
  if (local_80.structPointerCount != 0) {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.step,local_80.elementCount);
    local_50.segment = local_80.segment;
    local_50.capTable = local_80.capTable;
    local_50.nestingLimit = local_80.nestingLimit;
  }
  pCVar15 = (CapTableReader *)0x0;
  SVar17.content =
       (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  uVar11 = generateId(uVar11,SVar17,(Reader)declaration->_reader);
  this->id = uVar11;
  pIVar3 = parent->module->compiler;
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  local_50.nestingLimit = 0x7fffffff;
  if ((declaration->_reader).pointerCount != 0) {
    local_50.segment = (declaration->_reader).segment;
    pCVar15 = (declaration->_reader).capTable;
    local_50.pointer = (declaration->_reader).pointers;
    local_50.nestingLimit = (declaration->_reader).nestingLimit;
  }
  local_50.capTable = pCVar15;
  _::PointerReader::getStruct((StructReader *)&local_80,&local_50,(word *)0x0);
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  local_50.capTable = (CapTableReader *)0x0;
  local_50.nestingLimit = 0x7fffffff;
  if (local_80.structPointerCount != 0) {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.step,local_80.elementCount);
    local_50.segment = local_80.segment;
    local_50.capTable = local_80.capTable;
    local_50.nestingLimit = local_80.nestingLimit;
  }
  WVar16 = FILE;
  RVar18 = _::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  SVar17.content.size_ = in_R8;
  SVar17.content.ptr = RVar18.super_StringPtr.content.size_;
  AVar19 = (ArrayPtr<const_char>)
           joinDisplayName((Node *)&pIVar3->nodeArena,(Arena *)parent,
                           RVar18.super_StringPtr.content.ptr,SVar17);
  (this->displayName).content = AVar19;
  if (0x1f < (declaration->_reader).dataSize) {
    WVar16 = *(Which *)((long)(declaration->_reader).data + 2);
  }
  this->kind = WVar16;
  iVar14 = 0x7fffffff;
  pCVar15 = (CapTableReader *)0x0;
  if ((declaration->_reader).pointerCount < 8) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.segment = (declaration->_reader).segment;
    local_50.capTable = (declaration->_reader).capTable;
    local_50.pointer = (declaration->_reader).pointers + 7;
    local_50.nestingLimit = (declaration->_reader).nestingLimit;
  }
  _::PointerReader::getList(&local_80,&local_50,INLINE_COMPOSITE,(word *)0x0);
  this->genericParamCount = local_80.elementCount;
  this->isBuiltin = false;
  (this->guardedContent).state = STUB;
  p_Var1 = &(this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.pos =
       (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  (this->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).bootstrapSchema.ptr.isSet = false;
  (this->guardedContent).finalSchema.ptr.isSet = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
  (this->guardedContent).auxSchemas.size_ = 0;
  (this->guardedContent).auxSchemas.disposer = (ArrayDisposer *)0x0;
  (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
  (this->guardedContent).sourceInfo.size_ = 0;
  (this->guardedContent).sourceInfo.disposer = (ArrayDisposer *)0x0;
  this->inGetContent = false;
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  if ((declaration->_reader).pointerCount != 0) {
    local_50.segment = (declaration->_reader).segment;
    pCVar15 = (declaration->_reader).capTable;
    local_50.pointer = (declaration->_reader).pointers;
    iVar14 = (declaration->_reader).nestingLimit;
  }
  __return_storage_ptr__ = &local_80;
  local_50.capTable = pCVar15;
  local_50.nestingLimit = iVar14;
  _::PointerReader::getStruct((StructReader *)__return_storage_ptr__,&local_50,(word *)0x0);
  if (local_80.structPointerCount == 0) {
    local_80.nestingLimit = 0x7fffffff;
    local_80.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_80.segment = (SegmentReader *)0x0;
  }
  else {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.step,local_80.elementCount);
  }
  local_50.segment = local_80.segment;
  local_50.capTable = local_80.capTable;
  local_50.nestingLimit = local_80.nestingLimit;
  RVar18 = _::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  if (RVar18.super_StringPtr.content.size_ == 1) {
    uVar2 = (declaration->_reader).dataSize;
    uVar10 = 0;
    uVar12 = 0;
    if (0x3f < uVar2) {
      uVar12 = *(uint32_t *)((long)(declaration->_reader).data + 4);
    }
    this->startByte = uVar12;
    lVar13 = 8;
    __return_storage_ptr__ = (ListReader *)declaration;
    if (uVar2 < 0x60) goto LAB_0015578a;
  }
  else {
    uVar10 = 0;
    uVar12 = 0;
    if (0x1f < local_80.structDataSize) {
      uVar12 = *(uint32_t *)local_80.ptr;
    }
    this->startByte = uVar12;
    lVar13 = 4;
    if (local_80.structDataSize < 0x40) goto LAB_0015578a;
  }
  uVar10 = *(uint32_t *)(__return_storage_ptr__->ptr + lVar13);
LAB_0015578a:
  this->endByte = uVar10;
  uVar11 = Impl::addNode(this->module->compiler,this->id,this);
  this->id = uVar11;
  return;
}

Assistant:

Compiler::Node::Node(Node& parent, const Declaration::Reader& declaration)
    : module(parent.module),
      parent(parent),
      declaration(declaration),
      id(generateId(parent.id, declaration.getName().getValue(), declaration.getId())),
      displayName(joinDisplayName(parent.module->getCompiler().getNodeArena(),
                                  parent, declaration.getName().getValue())),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module->getCompiler().addNode(id, *this);
}